

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

uint64_t basisu::pack_eac_a8(pack_eac_a8_results *results,uint8_t *pPixels,uint32_t num_pixels,
                            uint32_t base_search_rad,uint32_t mul_search_rad,uint32_t table_mask)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uchar *puVar8;
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  uint *in_RDI;
  int in_R8D;
  uint in_R9D;
  float fVar9;
  undefined1 extraout_var [12];
  undefined1 auVar10 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar11 [16];
  uint32_t err;
  int v;
  uint32_t s;
  uint32_t best_s;
  uint32_t best_s_err;
  int a_1;
  uint32_t i_2;
  uint64_t total_err;
  int multiplier;
  int base;
  int mul_high;
  int mul_low;
  int mul;
  int base_max;
  int base_min;
  int center;
  float range;
  uint32_t table;
  uint64_t best_err;
  uint32_t alpha_range;
  uint32_t i_1;
  uint32_t a;
  uint32_t i;
  uint32_t max_alpha;
  uint32_t min_alpha;
  undefined4 in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  uint in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  uint uVar12;
  undefined4 in_stack_ffffffffffffff7c;
  uint uVar13;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar14;
  ulong local_78;
  uint local_70;
  uint local_6c;
  uint local_4c;
  uint64_t local_48;
  uint local_3c;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint64_t local_8;
  
  vector<unsigned_char>::resize
            ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             SUB41(in_stack_ffffffffffffff74 >> 0x18,0));
  vector<unsigned_char>::resize
            ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             SUB41(in_stack_ffffffffffffff74 >> 0x18,0));
  local_2c = 0xff;
  local_30 = 0;
  for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
    uVar5 = (uint)*(byte *)(in_RSI + (ulong)local_34);
    if (uVar5 < local_2c) {
      local_2c = uVar5;
    }
    if (local_30 < uVar5) {
      local_30 = uVar5;
    }
  }
  if (local_2c == local_30) {
    *in_RDI = local_2c;
    in_RDI[1] = 0xd;
    in_RDI[2] = 1;
    for (local_3c = 0; local_3c < in_EDX; local_3c = local_3c + 1) {
      puVar8 = vector<unsigned_char>::operator[]
                         ((vector<unsigned_char> *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      *puVar8 = '\x04';
    }
    local_8 = 0;
  }
  else {
    local_48 = 0xffffffffffffffff;
    for (local_4c = 0; local_4c < 0x10; local_4c = local_4c + 1) {
      if ((in_R9D & 1 << ((byte)local_4c & 0x1f)) != 0) {
        cVar1 = g_etc2_eac_tables[(ulong)local_4c * 8 + 7];
        cVar2 = g_etc2_eac_tables[(ulong)local_4c * 8 + 3];
        fVar9 = lerp<float,float>((float)local_2c,(float)local_30,
                                  (float)-(int)(char)g_etc2_eac_tables[(ulong)local_4c * 8 + 3] /
                                  (float)((int)cVar1 - (int)cVar2));
        auVar10._0_4_ = fVar9 + (float)((uint)fVar9 & 0x80000000 | 0x3effffff);
        auVar10._4_12_ = extraout_var;
        auVar10 = roundss(auVar10,auVar10,0xb);
        bVar3 = clamp255((int)auVar10._0_4_ - in_ECX);
        local_6c = (uint)bVar3;
        bVar3 = clamp255((int)auVar10._0_4_ + in_ECX);
        fVar9 = (float)(local_30 - local_2c) / (float)((int)cVar1 - (int)cVar2);
        auVar11._0_4_ = fVar9 + (float)((uint)fVar9 & 0x80000000 | 0x3effffff);
        auVar11._4_12_ = extraout_var_00;
        auVar10 = roundss(auVar11,auVar11,0xb);
        uVar5 = clamp<int>((int)auVar10._0_4_ - in_R8D,1,0xf);
        iVar6 = clamp<int>((int)auVar10._0_4_ + in_R8D,1,0xf);
        for (; local_70 = uVar5, (int)local_6c <= (int)(uint)bVar3; local_6c = local_6c + 1) {
          for (; (int)local_70 <= iVar6; local_70 = local_70 + 1) {
            local_78 = 0;
            for (uVar14 = 0; uVar14 < in_EDX; uVar14 = uVar14 + 1) {
              uVar7 = (uint)*(byte *)(in_RSI + (ulong)uVar14);
              uVar13 = 0xffffffff;
              uVar12 = 0;
              for (in_stack_ffffffffffffff74 = 0; in_stack_ffffffffffffff74 < 8;
                  in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 + 1) {
                bVar4 = clamp255(local_70 *
                                 (int)(char)g_etc2_eac_tables
                                            [(ulong)in_stack_ffffffffffffff74 + (ulong)local_4c * 8]
                                 + local_6c);
                in_stack_ffffffffffffff70 = (uint)bVar4;
                in_stack_ffffffffffffff6c = iabs(uVar7 - in_stack_ffffffffffffff70);
                if (in_stack_ffffffffffffff6c < uVar13) {
                  uVar12 = in_stack_ffffffffffffff74;
                  uVar13 = in_stack_ffffffffffffff6c;
                }
              }
              in_stack_ffffffffffffff68 = CONCAT13((char)uVar12,(int3)in_stack_ffffffffffffff68);
              puVar8 = vector<unsigned_char>::operator[]
                                 ((vector<unsigned_char> *)
                                  CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                  CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
              *puVar8 = (uchar)((uint)in_stack_ffffffffffffff68 >> 0x18);
              local_78 = uVar13 * uVar13 + local_78;
              if (local_48 <= local_78) break;
            }
            if (local_78 < local_48) {
              local_48 = local_78;
              *in_RDI = local_6c;
              in_RDI[2] = local_70;
              in_RDI[1] = local_4c;
              vector<unsigned_char>::swap
                        ((vector<unsigned_char> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (vector<unsigned_char> *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
              if (local_78 == 0) {
                return 0;
              }
            }
          }
        }
      }
    }
    local_8 = local_48;
  }
  return local_8;
}

Assistant:

uint64_t pack_eac_a8(pack_eac_a8_results& results, const uint8_t* pPixels, uint32_t num_pixels, uint32_t base_search_rad, uint32_t mul_search_rad, uint32_t table_mask)
	{
		results.m_selectors.resize(num_pixels);
		results.m_selectors_temp.resize(num_pixels);

		uint32_t min_alpha = 255, max_alpha = 0;
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const uint32_t a = pPixels[i];
			if (a < min_alpha) min_alpha = a;
			if (a > max_alpha) max_alpha = a;
		}

		if (min_alpha == max_alpha)
		{
			results.m_base = min_alpha;
			results.m_table = 13;
			results.m_multiplier = 1;
			for (uint32_t i = 0; i < num_pixels; i++)
				results.m_selectors[i] = 4;
			return 0;
		}

		const uint32_t alpha_range = max_alpha - min_alpha;

		uint64_t best_err = UINT64_MAX;

		for (uint32_t table = 0; table < 16; table++)
		{
			if ((table_mask & (1U << table)) == 0)
				continue;

			const float range = (float)(g_etc2_eac_tables[table][ETC2_EAC_MAX_VALUE_SELECTOR] - g_etc2_eac_tables[table][ETC2_EAC_MIN_VALUE_SELECTOR]);
			const int center = (int)roundf(lerp((float)min_alpha, (float)max_alpha, (float)(0 - g_etc2_eac_tables[table][ETC2_EAC_MIN_VALUE_SELECTOR]) / range));

			const int base_min = clamp255(center - base_search_rad);
			const int base_max = clamp255(center + base_search_rad);

			const int mul = (int)roundf(alpha_range / range);
			const int mul_low = clamp<int>(mul - mul_search_rad, 1, 15);
			const int mul_high = clamp<int>(mul + mul_search_rad, 1, 15);

			for (int base = base_min; base <= base_max; base++)
			{
				for (int multiplier = mul_low; multiplier <= mul_high; multiplier++)
				{
					uint64_t total_err = 0;

					for (uint32_t i = 0; i < num_pixels; i++)
					{
						const int a = pPixels[i];

						uint32_t best_s_err = UINT32_MAX;
						uint32_t best_s = 0;
						for (uint32_t s = 0; s < 8; s++)
						{
							const int v = clamp255((int)multiplier * g_etc2_eac_tables[table][s] + (int)base);

							uint32_t err = iabs(a - v);
							if (err < best_s_err)
							{
								best_s_err = err;
								best_s = s;
							}
						}

						results.m_selectors_temp[i] = static_cast<uint8_t>(best_s);

						total_err += best_s_err * best_s_err;
						if (total_err >= best_err)
							break;
					}

					if (total_err < best_err)
					{
						best_err = total_err;
						results.m_base = base;
						results.m_multiplier = multiplier;
						results.m_table = table;
						results.m_selectors.swap(results.m_selectors_temp);
						if (!best_err)
							return best_err;
					}

				} // table

			} // multiplier

		} // base

		return best_err;
	}